

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

Tcl_HashEntry * ArrayCreate(Tcl_HashTable *tablePtr,char *key,int *newPtr)

{
  uint uVar1;
  Tcl_HashEntry *pTVar2;
  undefined4 *in_RDX;
  int *in_RSI;
  Tcl_HashTable *in_RDI;
  int count;
  int index;
  int *iPtr2;
  int *iPtr1;
  int *arrayPtr;
  Tcl_HashEntry *hPtr;
  int local_48;
  int local_44;
  anon_union_8_3_f08c7d79_for_key *local_40;
  int *local_38;
  Tcl_HashEntry *local_28;
  
  local_44 = 0;
  local_38 = in_RSI;
  for (local_48 = in_RDI->keyType; 0 < local_48; local_48 = local_48 + -1) {
    local_44 = *local_38 + local_44;
    local_38 = local_38 + 1;
  }
  uVar1 = (uint)((long)local_44 * 0x41c64e6d >> ((byte)in_RDI->downShift & 0x3f)) & in_RDI->mask;
  local_28 = in_RDI->buckets[(int)uVar1];
  do {
    if (local_28 == (Tcl_HashEntry *)0x0) {
      *in_RDX = 1;
      pTVar2 = (Tcl_HashEntry *)malloc((ulong)(in_RDI->keyType * 4 + 0x24));
      pTVar2->tablePtr = in_RDI;
      pTVar2->bucketPtr = in_RDI->buckets + (int)uVar1;
      pTVar2->nextPtr = *pTVar2->bucketPtr;
      pTVar2->clientData = (ClientData)0x0;
      local_40 = &pTVar2->key;
      local_38 = in_RSI;
      for (local_48 = in_RDI->keyType; 0 < local_48; local_48 = local_48 + -1) {
        local_40->words[0] = *local_38;
        local_38 = local_38 + 1;
        local_40 = (anon_union_8_3_f08c7d79_for_key *)((long)local_40 + 4);
      }
      *pTVar2->bucketPtr = pTVar2;
      in_RDI->numEntries = in_RDI->numEntries + 1;
      if (in_RDI->rebuildSize <= in_RDI->numEntries) {
        RebuildTable(in_RDI);
      }
      return pTVar2;
    }
    local_40 = &local_28->key;
    local_48 = in_RDI->keyType;
    local_38 = in_RSI;
    while( true ) {
      if (local_48 == 0) {
        *in_RDX = 0;
        return local_28;
      }
      if (*local_38 != local_40->words[0]) break;
      local_48 = local_48 + -1;
      local_38 = local_38 + 1;
      local_40 = (anon_union_8_3_f08c7d79_for_key *)((long)local_40 + 4);
    }
    local_28 = local_28->nextPtr;
  } while( true );
}

Assistant:

static Tcl_HashEntry *
ArrayCreate(Tcl_HashTable *tablePtr, register char *key, int *newPtr)
{
    register Tcl_HashEntry *hPtr;
    int *arrayPtr = (int *) key;
    register int *iPtr1, *iPtr2;
    int index, count;

    for (index = 0, count = tablePtr->keyType, iPtr1 = arrayPtr;
	 count > 0; count--, iPtr1++) {
	index += *iPtr1;
    }
    index = RANDOM_INDEX(tablePtr, index);

    /* 
     * Search all of the entries in the appropriate bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words,
	     count = tablePtr->keyType;; count--, iPtr1++, iPtr2++) {
	    if (count == 0) {
		*newPtr = 0;
		return hPtr;
	    }
	    if (*iPtr1 != *iPtr2) {
		break;
	    }
	}
    }

    /* 
     * Entry not found.  Add a new one to the bucket.
     */

    *newPtr = 1;
    hPtr = (Tcl_HashEntry *) malloc((unsigned) (sizeof(Tcl_HashEntry)
			       + (tablePtr->keyType * sizeof(int)) - 4));
    hPtr->tablePtr = tablePtr;
    hPtr->bucketPtr = &(tablePtr->buckets[index]);
    hPtr->nextPtr = *hPtr->bucketPtr;
    hPtr->clientData = 0;
    for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words, count = tablePtr->keyType;
	 count > 0; count--, iPtr1++, iPtr2++) {
	*iPtr2 = *iPtr1;
    }
    *hPtr->bucketPtr = hPtr;
    tablePtr->numEntries++;

    /* 
     * If the table has exceeded a decent size, rebuild it with many
     * more buckets.
     */

    if (tablePtr->numEntries >= tablePtr->rebuildSize) {
	RebuildTable(tablePtr);
    }
    return hPtr;
}